

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZEqnArray<float>,_10>::~TPZManVector(TPZManVector<TPZEqnArray<float>,_10> *this)

{
  long lVar1;
  
  (this->super_TPZVec<TPZEqnArray<float>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_017c3548
  ;
  if ((this->super_TPZVec<TPZEqnArray<float>_>).fStore == (TPZEqnArray<float> *)&this->field_0x20) {
    (this->super_TPZVec<TPZEqnArray<float>_>).fStore = (TPZEqnArray<float> *)0x0;
  }
  (this->super_TPZVec<TPZEqnArray<float>_>).fNAlloc = 0;
  lVar1 = 0x13a90;
  do {
    TPZEqnArray<float>::~TPZEqnArray
              ((TPZEqnArray<float> *)
               ((long)&(this->super_TPZVec<TPZEqnArray<float>_>)._vptr_TPZVec + lVar1));
    lVar1 = lVar1 + -0x22f0;
  } while (lVar1 != -0x22d0);
  TPZVec<TPZEqnArray<float>_>::~TPZVec(&this->super_TPZVec<TPZEqnArray<float>_>);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}